

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O1

void __thiscall
phmap::priv::
node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
::destroy(node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
          *this)

{
  slot_type *in_RSI;
  
  if ((this->alloc_).super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
      super__Optional_payload<std::allocator<int>,_true,_false,_false>.
      super__Optional_payload_base<std::allocator<int>_>._M_engaged == true) {
    (anonymous_namespace)::StringPolicy::destroy<std::allocator<int>>
              ((allocator<int> *)&this->slot_space_,in_RSI);
    if ((this->alloc_).super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
        super__Optional_payload<std::allocator<int>,_true,_false,_false>.
        super__Optional_payload_base<std::allocator<int>_>._M_engaged == false) {
      __assert_fail("alloc_.has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                    ,0xb04,
                    "void phmap::priv::node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous namespace)::StringPolicy>, std::allocator<int>>::reset() [PolicyTraits = phmap::priv::hash_policy_traits<phmap::priv::(anonymous namespace)::StringPolicy>, Alloc = std::allocator<int>]"
                   );
    }
    (this->alloc_).super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
    super__Optional_payload<std::allocator<int>,_true,_false,_false>.
    super__Optional_payload_base<std::allocator<int>_>._M_engaged = false;
  }
  return;
}

Assistant:

void destroy() {
        if (!empty()) {
            PolicyTraits::destroy(alloc(), slot());
            reset();
        }
    }